

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int sort_5_3::insert_sort_b_1(int *a,int n)

{
  int iVar1;
  code *pcVar2;
  int iVar3;
  int local_2c;
  int local_28;
  int j;
  int i;
  int t;
  int high;
  int low;
  int mid;
  int n_local;
  int *a_local;
  
  for (local_28 = 0; local_28 < n; local_28 = local_28 + 1) {
    t = 0;
    i = local_28 + -1;
    iVar1 = a[local_28];
    while (iVar3 = local_28, t <= i) {
      iVar3 = (t + i) / 2;
      if (a[iVar3] < iVar1) {
        t = iVar3 + 1;
      }
      else {
        i = iVar3 + -1;
      }
    }
    while (local_2c = iVar3 + -1, t <= local_2c) {
      a[iVar3] = a[local_2c];
      iVar3 = local_2c;
    }
    a[t] = iVar1;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

int insert_sort_b_1(int *a, int n) {
        int mid, low, high, t;
        for (int i = 0; i < n; i++) {
            low = 0, high = i - 1, t = a[i];
            while (low <= high) {
                mid = (low + high) / 2;
                if (a[mid] < t) {
                    low = mid + 1;
                } else
                    high = mid - 1;
            }

            for (int j = i - 1; j >= low; j--) {
                a[j + 1] = a[j];
            }
            a[low] = t;
        }
    }